

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

void __thiscall Expr::GenStrFromFormat(Expr *this,Env *env)

{
  uint uVar1;
  string local_30;
  
  uVar1 = this->num_operands_;
  if (uVar1 == 3) {
    strfmt_abi_cxx11_(&local_30,expr_fmt[this->expr_type_],
                      (this->operand_[0]->str_)._M_dataplus._M_p,
                      (this->operand_[1]->str_)._M_dataplus._M_p,
                      (this->operand_[2]->str_)._M_dataplus._M_p);
  }
  else if (uVar1 == 2) {
    strfmt_abi_cxx11_(&local_30,expr_fmt[this->expr_type_],
                      (this->operand_[0]->str_)._M_dataplus._M_p,
                      (this->operand_[1]->str_)._M_dataplus._M_p);
  }
  else {
    if (uVar1 != 1) {
      if (!FLAGS_pac_debug) {
        return;
      }
      fprintf(_stderr,"num_operands_ = %d, orig = %s\n",(ulong)uVar1,(this->orig_)._M_dataplus._M_p)
      ;
      return;
    }
    strfmt_abi_cxx11_(&local_30,expr_fmt[this->expr_type_],
                      (this->operand_[0]->str_)._M_dataplus._M_p);
  }
  std::__cxx11::string::operator=((string *)&this->str_,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Expr::GenStrFromFormat(Env* env)
	{
	// The format != "@custom@"
	ASSERT(*expr_fmt[expr_type_] != '@');

	switch ( num_operands_ )
		{
		case 1:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str());
			break;
		case 2:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str(), operand_[1]->str());
			break;
		case 3:
			str_ = strfmt(expr_fmt[expr_type_], operand_[0]->str(), operand_[1]->str(),
			              operand_[2]->str());
			break;
		default:
			DEBUG_MSG("num_operands_ = %d, orig = %s\n", num_operands_, orig());
			ASSERT(0);
			break;
		}
	}